

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

handle pybind11::detail::
       map_caster<std::unordered_map<long,long,std::hash<long>,std::equal_to<long>,std::allocator<std::pair<long_const,long>>>,long,long>
       ::
       cast<std::unordered_map<long,long,std::hash<long>,std::equal_to<long>,std::allocator<std::pair<long_const,long>>>const&>
                 (vector<bool,_std::allocator<bool>_> *src,return_value_policy policy,handle parent)

{
  bool bVar1;
  type this;
  undefined8 in_RDX;
  undefined1 in_SIL;
  undefined8 in_RDI;
  object value;
  object key;
  value_type *kv;
  const_iterator __end0;
  const_iterator __begin0;
  vector<bool,_std::allocator<bool>_> *__range3;
  return_value_policy policy_value;
  return_value_policy policy_key;
  dict d;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff18;
  type in_stack_ffffffffffffff20;
  handle in_stack_ffffffffffffff28;
  dict *in_stack_ffffffffffffff40;
  object_api<pybind11::handle> *in_stack_ffffffffffffff50;
  handle in_stack_ffffffffffffff58;
  handle local_80;
  undefined8 local_78;
  PyObject *local_60;
  handle local_58;
  reference local_50;
  _Node_iterator_base<std::pair<const_long,_long>,_false> local_48;
  _Node_iterator_base<std::pair<const_long,_long>,_false> local_40;
  undefined8 local_38;
  undefined1 local_2a;
  undefined1 local_29;
  undefined1 local_19;
  undefined8 local_18;
  undefined8 local_10;
  handle local_8;
  
  local_19 = in_SIL;
  local_18 = in_RDI;
  local_10 = in_RDX;
  dict::dict(in_stack_ffffffffffffff40);
  local_29 = local_19;
  local_2a = local_19;
  local_38 = local_18;
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<long,_long,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
       ::begin(in_stack_ffffffffffffff18);
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<long,_long,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
       ::end(in_stack_ffffffffffffff18);
  while (bVar1 = std::__detail::operator!=(&local_40,&local_48), bVar1) {
    local_50 = std::__detail::_Node_const_iterator<std::pair<const_long,_long>,_false,_false>::
               operator*((_Node_const_iterator<std::pair<const_long,_long>,_false,_false> *)0x474fcf
                        );
    forward_like<std::unordered_map<long,long,std::hash<long>,std::equal_to<long>,std::allocator<std::pair<long_const,long>>>const&,long_const&>
              (&local_50->first);
    local_78 = local_10;
    this = type_caster<long,_void>::cast<long>
                     (in_stack_ffffffffffffff20.m_ptr,
                      (return_value_policy)((ulong)in_stack_ffffffffffffff18 >> 0x38),
                      in_stack_ffffffffffffff28);
    local_60 = this.m_ptr;
    reinterpret_steal<pybind11::object>(in_stack_ffffffffffffff28);
    in_stack_ffffffffffffff28.m_ptr =
         (PyObject *)
         forward_like<std::unordered_map<long,long,std::hash<long>,std::equal_to<long>,std::allocator<std::pair<long_const,long>>>const&,long_const&>
                   (&local_50->second);
    in_stack_ffffffffffffff20 =
         type_caster<long,_void>::cast<long>
                   (in_stack_ffffffffffffff20.m_ptr,
                    (return_value_policy)((ulong)in_stack_ffffffffffffff18 >> 0x38),
                    in_stack_ffffffffffffff28);
    reinterpret_steal<pybind11::object>(in_stack_ffffffffffffff28);
    bVar1 = pybind11::handle::operator_cast_to_bool(&local_58);
    if ((bVar1) && (bVar1 = pybind11::handle::operator_cast_to_bool(&local_80), bVar1)) {
      object_api<pybind11::handle>::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff58);
      accessor<pybind11::detail::accessor_policies::generic_item>::operator=
                ((accessor<pybind11::detail::accessor_policies::generic_item> *)this.m_ptr,
                 (object *)in_stack_ffffffffffffff28.m_ptr);
      accessor<pybind11::detail::accessor_policies::generic_item>::~accessor
                ((accessor<pybind11::detail::accessor_policies::generic_item> *)
                 in_stack_ffffffffffffff20.m_ptr);
      bVar1 = false;
    }
    else {
      memset(&local_8,0,8);
      pybind11::handle::handle(&local_8);
      bVar1 = true;
    }
    object::~object((object *)0x475169);
    object::~object((object *)0x475176);
    if (bVar1) goto LAB_00475206;
    std::__detail::_Node_const_iterator<std::pair<const_long,_long>,_false,_false>::operator++
              ((_Node_const_iterator<std::pair<const_long,_long>,_false,_false> *)
               in_stack_ffffffffffffff20.m_ptr);
  }
  local_8 = object::release((object *)in_stack_ffffffffffffff18);
LAB_00475206:
  dict::~dict((dict *)0x475213);
  return (handle)local_8.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        dict d;
        return_value_policy policy_key = policy;
        return_value_policy policy_value = policy;
        if (!std::is_lvalue_reference<T>::value) {
            policy_key = return_value_policy_override<Key>::policy(policy_key);
            policy_value = return_value_policy_override<Value>::policy(policy_value);
        }
        for (auto &&kv : src) {
            auto key = reinterpret_steal<object>(key_conv::cast(forward_like<T>(kv.first), policy_key, parent));
            auto value = reinterpret_steal<object>(value_conv::cast(forward_like<T>(kv.second), policy_value, parent));
            if (!key || !value)
                return handle();
            d[key] = value;
        }
        return d.release();
    }